

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::Inserter::insertOne(Inserter *this,qsizetype pos,Replace *t)

{
  qsizetype in_RSI;
  Inserter *in_RDI;
  qsizetype i;
  Replace *in_stack_ffffffffffffffe0;
  Replace *this_00;
  
  setup(in_RDI,in_RSI,1);
  if (in_RDI->sourceCopyConstruct == 0) {
    Replace::Replace(in_stack_ffffffffffffffe0,(Replace *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
    for (this_00 = (Replace *)0x0; this_00 != (Replace *)in_RDI->move;
        this_00 = (Replace *)((long)&this_00[-1].out.d.size + 7)) {
      Replace::operator=(this_00,(Replace *)in_RDI);
    }
    Replace::operator=(this_00,(Replace *)in_RDI);
  }
  else {
    Replace::Replace(in_stack_ffffffffffffffe0,(Replace *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }